

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O1

bool __thiscall bssl::Array<int>::Init(Array<int> *this,size_t new_size)

{
  size_t sVar1;
  int *piVar2;
  bool bVar3;
  
  bVar3 = InitUninitialized(this,new_size);
  if ((bVar3) && (sVar1 = this->size_, sVar1 != 0)) {
    piVar2 = this->data_;
    *piVar2 = 0;
    if (sVar1 != 1) {
      memset(piVar2 + 1,0,sVar1 * 4 - 4);
    }
  }
  return bVar3;
}

Assistant:

[[nodiscard]] bool Init(size_t new_size) {
    if (!InitUninitialized(new_size)) {
      return false;
    }
    std::uninitialized_value_construct_n(data_, size_);
    return true;
  }